

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

void mcmunl(mcmcx1def *ctx,mcmon n,mcmon *lst)

{
  byte *pbVar1;
  ushort uVar2;
  mcmon mVar3;
  mcmodef *pmVar4;
  uint uVar5;
  mcmodef *pmVar6;
  undefined6 in_register_00000032;
  mcmodef *pmVar7;
  mcmon *pmVar8;
  
  uVar5 = (n & 0xff) << 5;
  pmVar4 = ctx->mcmcxtab[CONCAT62(in_register_00000032,n) >> 8 & 0xffffff];
  pmVar8 = &ctx->mcmcxlru;
  if (pmVar8 == lst) {
    if (ctx->mcmcxmru == n) {
      uVar2 = *(ushort *)((long)&pmVar4->mcmoprv + (ulong)uVar5);
      ctx->mcmcxmru = uVar2;
      if (uVar2 != 0xffff) {
        pmVar8 = &ctx->mcmcxtab[uVar2 >> 8][(byte)uVar2].mcmonxt;
      }
      *pmVar8 = 0xffff;
    }
    pbVar1 = (byte *)((long)&pmVar4->mcmoflg + (ulong)uVar5);
    *pbVar1 = *pbVar1 & 0xef;
  }
  uVar2 = *(ushort *)((long)&pmVar4->mcmonxt + (ulong)uVar5);
  if (uVar2 == 0xffff) {
    pmVar6 = (mcmodef *)0x0;
  }
  else {
    pmVar6 = ctx->mcmcxtab[uVar2 >> 8] + (byte)uVar2;
  }
  uVar2 = *(ushort *)((long)&pmVar4->mcmoprv + (ulong)uVar5);
  if (uVar2 == 0xffff) {
    pmVar7 = (mcmodef *)0x0;
  }
  else {
    pmVar7 = ctx->mcmcxtab[uVar2 >> 8] + (byte)uVar2;
  }
  if (pmVar6 != (mcmodef *)0x0) {
    pmVar6->mcmoprv = uVar2;
  }
  mVar3 = *(mcmon *)((long)&pmVar4->mcmonxt + (ulong)uVar5);
  if (pmVar7 == (mcmodef *)0x0) {
    *lst = mVar3;
  }
  else {
    pmVar7->mcmonxt = mVar3;
  }
  *(undefined4 *)((long)&pmVar4->mcmonxt + (ulong)uVar5) = 0xffffffff;
  return;
}

Assistant:

static void mcmunl(mcmcx1def *ctx, mcmon n, mcmon *lst)
{
    mcmodef *o = mcmgobje(ctx, n);
    mcmodef *nxt;
    mcmodef *prv;
    
    MCMGLBCTX(ctx);

    /* see if this is LRU chain - must deal with MRU pointer if so */
    if (lst == &ctx->mcmcxlru)
    {
        /* if it's at MRU, set MRU pointer to previous object in list */
        if (ctx->mcmcxmru == n)
        {
            ctx->mcmcxmru = o->mcmoprv;     /* set MRU to previous in chain */
            if (ctx->mcmcxmru != MCMONINV)           /* set nxt for new MRU */
                mcmgobje(ctx, ctx->mcmcxmru)->mcmonxt = MCMONINV;
            else
                ctx->mcmcxlru = MCMONINV;     /* nothing in list; clear LRU */
        }
        o->mcmoflg &= ~MCMOFLRU;
    }
    
    nxt = o->mcmonxt == MCMONINV ? (mcmodef *)0 : mcmgobje(ctx, o->mcmonxt);
    prv = o->mcmoprv == MCMONINV ? (mcmodef *)0 : mcmgobje(ctx, o->mcmoprv);
    
    /* set back link for next object, if there is a next object */
    if (nxt) nxt->mcmoprv = o->mcmoprv;
    
    /* set forward link for previous object, or head if no previous object */
    if (prv) prv->mcmonxt = o->mcmonxt;
    else *lst = o->mcmonxt;
    
    o->mcmonxt = o->mcmoprv = MCMONINV;
}